

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound-core.c
# Opt level: O0

void play_sound(game_event_type type,game_event_data *data,void *user)

{
  uint32_t uVar1;
  uint uVar2;
  wchar_t sound_id;
  wchar_t s;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  if (hooks.play_sound_hook != (_func__Bool_sound_data_ptr *)0x0) {
    if ((data->message).type < L'\0') {
      __assert_fail("data->message.type >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/sound-core.c"
                    ,0x13b,"void play_sound(game_event_type, game_event_data *, void *)");
    }
    if (message_sounds[(data->message).type].num_sounds != 0) {
      uVar1 = Rand_div((uint)message_sounds[(data->message).type].num_sounds);
      uVar2 = (uint)*(ushort *)((long)(data->message).type * 0x22 + 0x313462 + (long)(int)uVar1 * 2)
      ;
      if (next_sound_id <= uVar2) {
        __assert_fail("(sound_id >= 0) && (sound_id < next_sound_id)",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/sound-core.c"
                      ,0x144,"void play_sound(game_event_type, game_event_data *, void *)");
      }
      if (sounds[(int)uVar2].status == SOUND_ST_UNKNOWN) {
        load_sound(sounds + (int)uVar2);
      }
      if (sounds[(int)uVar2].status == SOUND_ST_LOADED) {
        (*hooks.play_sound_hook)(sounds + (int)uVar2);
      }
    }
  }
  return;
}

Assistant:

static void play_sound(game_event_type type, game_event_data *data, void *user)
{
	int s, sound_id;

	if (hooks.play_sound_hook) {
		/* Paranoia */
		assert(data->message.type >= 0);

		if (!message_sounds[data->message.type].num_sounds)
			return; /* No sounds for this message */

		s = randint0(message_sounds[data->message.type].num_sounds);

		sound_id = message_sounds[data->message.type].sound_ids[s];

		assert((sound_id >= 0) && (sound_id < next_sound_id));

		/* Ensure the sound is loaded before we play it */
		if (sounds[sound_id].status == SOUND_ST_UNKNOWN)
			load_sound(&sounds[sound_id]);

		/* Only bother playing it if the platform can */
		if (sounds[sound_id].status == SOUND_ST_LOADED)
			hooks.play_sound_hook(&sounds[sound_id]);
	}
}